

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

void render_svg(element_t *element,render_context_t *context,render_state_t *state)

{
  float x_00;
  float y_00;
  float width;
  float height;
  length_t h;
  length_t w;
  length_t y;
  length_t x;
  
  if (element->parent == (element *)0x0) {
    width = context->document->width;
    x_00 = 0.0;
    y_00 = 0.0;
    height = context->document->height;
  }
  else {
    x.value = 0.0;
    x.type = length_type_fixed;
    y.value = 0.0;
    y.type = length_type_fixed;
    w.value = 100.0;
    w.type = length_type_percent;
    h.value = 100.0;
    h.type = length_type_percent;
    parse_length(element,0x2a,&x,true,false);
    parse_length(element,0x2d,&y,true,false);
    parse_length(element,0x29,&w,false,false);
    parse_length(element,0x10,&h,false,false);
    x_00 = x.value;
    if (x.type == length_type_percent) {
      x_00 = (state->view_width * x.value) / 100.0;
    }
    y_00 = y.value;
    if (y.type == length_type_percent) {
      y_00 = (state->view_height * y.value) / 100.0;
    }
    width = w.value;
    if (w.type == length_type_percent) {
      width = (state->view_width * w.value) / 100.0;
    }
    height = h.value;
    if (h.type == length_type_percent) {
      height = (state->view_height * h.value) / 100.0;
    }
  }
  render_symbol(element,context,state,x_00,y_00,width,height);
  return;
}

Assistant:

static void render_svg(const element_t* element, const render_context_t* context, render_state_t* state)
{
    if(element->parent == NULL) {
        render_symbol(element, context, state, 0.f, 0.f, context->document->width, context->document->height);
        return;
    }

    length_t x = {0, length_type_fixed};
    length_t y = {0, length_type_fixed};

    length_t w = {100, length_type_percent};
    length_t h = {100, length_type_percent};

    parse_length(element, ATTR_X, &x, true, false);
    parse_length(element, ATTR_Y, &y, true, false);
    parse_length(element, ATTR_WIDTH, &w, false, false);
    parse_length(element, ATTR_HEIGHT, &h, false, false);

    float _x = resolve_length(state, &x, 'x');
    float _y = resolve_length(state, &y, 'y');
    float _w = resolve_length(state, &w, 'x');
    float _h = resolve_length(state, &h, 'y');
    render_symbol(element, context, state, _x, _y, _w, _h);
}